

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

int MRIStepRootInit(void *arkode_mem,int nrtfn,ARKRootFn g)

{
  long lVar1;
  uint uVar2;
  long *plVar3;
  void *__ptr;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  char *module;
  int error_code;
  char *msgfmt;
  uint uVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  
  if (arkode_mem == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::MRIStep","MRIStepRootInit",
                    "arkode_mem = NULL illegal.");
    return -0x15;
  }
  if (arkode_mem == (void *)0x0) {
    module = "ARKode";
    msgfmt = "arkode_mem = NULL illegal.";
    error_code = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    goto LAB_004b346b;
  }
  uVar7 = 0;
  if (0 < nrtfn) {
    uVar7 = nrtfn;
  }
  plVar3 = *(long **)((long)arkode_mem + 0x280);
  if (plVar3 == (long *)0x0) {
    plVar3 = (long *)malloc(0x88);
    *(long **)((long)arkode_mem + 0x280) = plVar3;
    if (plVar3 == (long *)0x0) {
      arkProcessError((ARKodeMem)arkode_mem,0,"ARKode","arkRootInit",
                      "Allocation of arkode_mem failed.");
      return -0x14;
    }
    *plVar3 = 0;
    *(undefined4 *)(plVar3 + 1) = 0;
    *(undefined4 *)((long)plVar3 + 100) = 0;
    plVar3[0xe] = 0;
    plVar3[2] = 0;
    plVar3[3] = 0;
    plVar3[7] = 0;
    plVar3[8] = 0;
    plVar3[9] = 0;
    *(undefined4 *)(plVar3 + 0xf) = 1;
    plVar3[0x10] = *(long *)((long)arkode_mem + 0x10);
    *(long *)((long)arkode_mem + 0x218) = *(long *)((long)arkode_mem + 0x218) + 5;
    *(long *)((long)arkode_mem + 0x220) = *(long *)((long)arkode_mem + 0x220) + 0xc;
    uVar2 = 0;
  }
  else {
    uVar2 = *(uint *)(plVar3 + 1);
    if (0 < (int)uVar2 && uVar7 != uVar2) {
      free((void *)plVar3[7]);
      lVar1 = *(long *)((long)arkode_mem + 0x280);
      *(undefined8 *)(lVar1 + 0x38) = 0;
      free(*(void **)(lVar1 + 0x40));
      lVar1 = *(long *)((long)arkode_mem + 0x280);
      *(undefined8 *)(lVar1 + 0x40) = 0;
      free(*(void **)(lVar1 + 0x48));
      lVar1 = *(long *)((long)arkode_mem + 0x280);
      *(undefined8 *)(lVar1 + 0x48) = 0;
      free(*(void **)(lVar1 + 0x10));
      lVar1 = *(long *)((long)arkode_mem + 0x280);
      *(undefined8 *)(lVar1 + 0x10) = 0;
      free(*(void **)(lVar1 + 0x18));
      lVar1 = *(long *)((long)arkode_mem + 0x280);
      *(undefined8 *)(lVar1 + 0x18) = 0;
      free(*(void **)(lVar1 + 0x70));
      plVar3 = *(long **)((long)arkode_mem + 0x280);
      plVar3[0xe] = 0;
      uVar2 = *(uint *)(plVar3 + 1);
      lVar1 = (long)(int)uVar2 * 3;
      auVar9._8_4_ = (int)lVar1;
      auVar9._0_8_ = lVar1;
      auVar9._12_4_ = (int)((ulong)lVar1 >> 0x20);
      *(long *)((long)arkode_mem + 0x218) =
           *(long *)((long)arkode_mem + 0x218) + (long)(int)uVar2 * -3;
      *(long *)((long)arkode_mem + 0x220) = *(long *)((long)arkode_mem + 0x220) - auVar9._8_8_;
    }
  }
  if (nrtfn < 1) {
    *(undefined4 *)(plVar3 + 1) = 0;
    *plVar3 = 0;
    return 0;
  }
  if (uVar7 == uVar2) {
    if ((ARKRootFn)*plVar3 == g) {
      return 0;
    }
    if (g != (ARKRootFn)0x0) {
      *plVar3 = (long)g;
      return 0;
    }
    free((void *)plVar3[7]);
    lVar1 = *(long *)((long)arkode_mem + 0x280);
    *(undefined8 *)(lVar1 + 0x38) = 0;
    free(*(void **)(lVar1 + 0x40));
    lVar1 = *(long *)((long)arkode_mem + 0x280);
    *(undefined8 *)(lVar1 + 0x40) = 0;
    free(*(void **)(lVar1 + 0x48));
    lVar1 = *(long *)((long)arkode_mem + 0x280);
    *(undefined8 *)(lVar1 + 0x48) = 0;
    free(*(void **)(lVar1 + 0x10));
    lVar1 = *(long *)((long)arkode_mem + 0x280);
    *(undefined8 *)(lVar1 + 0x10) = 0;
    free(*(void **)(lVar1 + 0x18));
    lVar1 = *(long *)((long)arkode_mem + 0x280);
    *(undefined8 *)(lVar1 + 0x18) = 0;
    free(*(void **)(lVar1 + 0x70));
    *(undefined8 *)(*(long *)((long)arkode_mem + 0x280) + 0x70) = 0;
    *(ulong *)((long)arkode_mem + 0x218) = *(long *)((long)arkode_mem + 0x218) - (ulong)(uVar7 * 3);
    *(ulong *)((long)arkode_mem + 0x220) = *(long *)((long)arkode_mem + 0x220) - (ulong)(uVar7 * 3);
  }
  else {
    *(uint *)(plVar3 + 1) = uVar7;
    if (g != (ARKRootFn)0x0) {
      *plVar3 = (long)g;
      sVar8 = (ulong)uVar7 * 8;
      __ptr = malloc(sVar8);
      plVar3[7] = (long)__ptr;
      if (__ptr == (void *)0x0) {
LAB_004b3450:
        module = "ARKode";
      }
      else {
        pvVar4 = malloc(sVar8);
        plVar3[8] = (long)pvVar4;
        if (pvVar4 == (void *)0x0) {
          free(__ptr);
          plVar3[7] = 0;
          goto LAB_004b3450;
        }
        pvVar4 = malloc(sVar8);
        plVar3[9] = (long)pvVar4;
        if (pvVar4 == (void *)0x0) {
          free(__ptr);
          plVar3[7] = 0;
          free((void *)plVar3[8]);
          *(undefined8 *)(*(long *)((long)arkode_mem + 0x280) + 0x40) = 0;
          goto LAB_004b3450;
        }
        sVar8 = (ulong)uVar7 << 2;
        pvVar4 = malloc(sVar8);
        plVar3[2] = (long)pvVar4;
        if (pvVar4 == (void *)0x0) {
          free(__ptr);
          plVar3[7] = 0;
          free((void *)plVar3[8]);
          lVar1 = *(long *)((long)arkode_mem + 0x280);
          *(undefined8 *)(lVar1 + 0x40) = 0;
          free(*(void **)(lVar1 + 0x48));
          *(undefined8 *)(*(long *)((long)arkode_mem + 0x280) + 0x48) = 0;
          goto LAB_004b3450;
        }
        pvVar4 = malloc(sVar8);
        plVar3[3] = (long)pvVar4;
        if (pvVar4 == (void *)0x0) {
          free(__ptr);
          plVar3[7] = 0;
          free((void *)plVar3[8]);
          lVar1 = *(long *)((long)arkode_mem + 0x280);
          *(undefined8 *)(lVar1 + 0x40) = 0;
          free(*(void **)(lVar1 + 0x48));
          lVar1 = *(long *)((long)arkode_mem + 0x280);
          *(undefined8 *)(lVar1 + 0x48) = 0;
          free(*(void **)(lVar1 + 0x10));
          *(undefined8 *)(*(long *)((long)arkode_mem + 0x280) + 0x10) = 0;
          goto LAB_004b3450;
        }
        pvVar5 = malloc(sVar8);
        plVar3[0xe] = (long)pvVar5;
        if (pvVar5 != (void *)0x0) {
          for (uVar6 = 0; (uint)nrtfn != uVar6; uVar6 = uVar6 + 1) {
            *(undefined4 *)((long)pvVar4 + uVar6 * 4) = 0;
          }
          for (uVar6 = 0; (uint)nrtfn != uVar6; uVar6 = uVar6 + 1) {
            *(undefined4 *)((long)pvVar5 + uVar6 * 4) = 1;
          }
          *(ulong *)((long)arkode_mem + 0x218) =
               (ulong)(uVar7 * 3) + *(long *)((long)arkode_mem + 0x218);
          *(ulong *)((long)arkode_mem + 0x220) =
               (ulong)(uVar7 * 3) + *(long *)((long)arkode_mem + 0x220);
          return 0;
        }
        free(__ptr);
        plVar3[7] = 0;
        free((void *)plVar3[8]);
        lVar1 = *(long *)((long)arkode_mem + 0x280);
        *(undefined8 *)(lVar1 + 0x40) = 0;
        free(*(void **)(lVar1 + 0x48));
        lVar1 = *(long *)((long)arkode_mem + 0x280);
        *(undefined8 *)(lVar1 + 0x48) = 0;
        free(*(void **)(lVar1 + 0x10));
        lVar1 = *(long *)((long)arkode_mem + 0x280);
        *(undefined8 *)(lVar1 + 0x10) = 0;
        free(*(void **)(lVar1 + 0x18));
        *(undefined8 *)(*(long *)((long)arkode_mem + 0x280) + 0x18) = 0;
        module = "ARKodeS";
      }
      msgfmt = "A memory request failed.";
      error_code = -0x14;
      goto LAB_004b346b;
    }
  }
  module = "ARKode";
  msgfmt = "g = NULL illegal.";
  error_code = -0x16;
LAB_004b346b:
  arkProcessError((ARKodeMem)arkode_mem,error_code,module,"arkRootInit",msgfmt);
  return error_code;
}

Assistant:

int MRIStepRootInit(void *arkode_mem, int nrtfn, ARKRootFn g)
{
  /* unpack ark_mem, call arkRootInit, and return */
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::MRIStep",
                    "MRIStepRootInit", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  return(arkRootInit(ark_mem, nrtfn, g));
}